

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O0

int XMLNode_remove_attribute(XMLNode *node,int i_attr)

{
  XMLAttribute *local_28;
  XMLAttribute *pt;
  int i_attr_local;
  XMLNode *node_local;
  
  if ((((node == (XMLNode *)0x0) || (node->init_value != 0x19770522)) || (i_attr < 0)) ||
     (node->n_attributes <= i_attr)) {
    node_local._4_4_ = -1;
  }
  else {
    if (node->n_attributes == 1) {
      local_28 = (XMLAttribute *)0x0;
    }
    else {
      local_28 = (XMLAttribute *)malloc((long)(node->n_attributes + -1) * 0x18);
      if (local_28 == (XMLAttribute *)0x0) {
        return -1;
      }
    }
    if (node->attributes[i_attr].name != (SXML_CHAR *)0x0) {
      free(node->attributes[i_attr].name);
    }
    if (node->attributes[i_attr].value != (SXML_CHAR *)0x0) {
      free(node->attributes[i_attr].value);
    }
    if (local_28 != (XMLAttribute *)0x0) {
      memcpy(local_28,node->attributes,(long)i_attr * 0x18);
      memcpy(local_28 + i_attr,node->attributes + (i_attr + 1),
             (long)((node->n_attributes - i_attr) + -1) * 0x18);
    }
    if (node->attributes != (XMLAttribute *)0x0) {
      free(node->attributes);
    }
    node->attributes = local_28;
    node->n_attributes = node->n_attributes + -1;
    node_local._4_4_ = node->n_attributes;
  }
  return node_local._4_4_;
}

Assistant:

int XMLNode_remove_attribute(XMLNode* node, int i_attr)
{
	XMLAttribute* pt;
	if (node == NULL || node->init_value != XML_INIT_DONE || i_attr < 0 || i_attr >= node->n_attributes)
		return -1;
	
	/* Before modifying first see if we run out of memory */
	if (node->n_attributes == 1)
		pt = NULL;
	else {
		pt = __malloc((node->n_attributes - 1) * sizeof(XMLAttribute));
		if (pt == NULL)
			return -1;
	}

	/* Can't fail anymore, free item */
	if (node->attributes[i_attr].name != NULL) __free(node->attributes[i_attr].name);
	if (node->attributes[i_attr].value != NULL) __free(node->attributes[i_attr].value);
	
	if (pt != NULL) {
		memcpy(pt, node->attributes, i_attr * sizeof(XMLAttribute));
		memcpy(&pt[i_attr], &node->attributes[i_attr + 1], (node->n_attributes - i_attr - 1) * sizeof(XMLAttribute));
	}
	if (node->attributes != NULL)
		__free(node->attributes);
	node->attributes = pt;
	node->n_attributes--;
	
	return node->n_attributes;
}